

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ints.cpp
# Opt level: O1

void test_limits<bool>(void)

{
  ostream *poVar1;
  bool *in_R8;
  string actual;
  string expected;
  stringstream str;
  bool local_1d2;
  char local_1d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  stringstream local_190 [16];
  undefined1 local_180 [112];
  ios_base local_110 [264];
  
  std::__cxx11::stringstream::stringstream(local_190);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(local_180,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__cxx11::stringbuf::str();
  local_1d1 = '\0';
  local_1d2 = true;
  format::string<std::__cxx11::string,char_const[8],bool,bool>
            (&local_1d0,(format *)"{0} {1}",(char (*) [8])&local_1d1,&local_1d2,in_R8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  expect_eq<std::__cxx11::string,std::__cxx11::string>
            (&local_1b0,&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/dacap[P]format/tests/ints.cpp",
             0x1b);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream(local_190);
  std::ios_base::~ios_base(local_110);
  return;
}

Assistant:

void test_limits() {
  std::stringstream str;
  str << std::numeric_limits<T>::min() << " "
      << std::numeric_limits<T>::max();

  std::string expected = str.str();
  std::string actual =
    format::string("{0} {1}",
                   std::numeric_limits<T>::min(),
                   std::numeric_limits<T>::max());

  std::cout << expected << "\n"
            << actual << "\n";

  EXPECT_EQ(expected, actual);
}